

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
::revalidate_if_necessary
          (iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
           *this,TreeIterator *it)

{
  bool bVar1;
  long *in_RDI;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  i;
  Node *l;
  size_type in_stack_ffffffffffffff58;
  size_type b;
  InnerMap *in_stack_ffffffffffffff60;
  TreeIterator *in_stack_ffffffffffffff80;
  MapKey *in_stack_ffffffffffffff88;
  InnerMap *in_stack_ffffffffffffff90;
  long lVar2;
  bool local_1;
  
  in_RDI[2] = *(long *)(in_RDI[1] + 8) - 1U & in_RDI[2];
  if (*(long *)(*(long *)(in_RDI[1] + 0x20) + in_RDI[2] * 8) == *in_RDI) {
    local_1 = true;
  }
  else {
    bVar1 = TableEntryIsNonEmptyList(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar1) {
      lVar2 = *(long *)(*(long *)(in_RDI[1] + 0x20) + in_RDI[2] * 8);
      do {
        lVar2 = *(long *)(lVar2 + 0x18);
        if (lVar2 == 0) {
          in_stack_ffffffffffffff90 = (InnerMap *)0x0;
          goto LAB_006f8c9c;
        }
      } while (lVar2 != *in_RDI);
      local_1 = true;
    }
    else {
LAB_006f8c9c:
      b = in_RDI[1];
      KeyPtrFromNodePtr((Node *)0x6f8cb1);
      InnerMap::find(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      in_RDI[2] = (long)in_stack_ffffffffffffff88;
      local_1 = TableEntryIsList(in_stack_ffffffffffffff60,b);
    }
  }
  return local_1;
}

Assistant:

bool revalidate_if_necessary(TreeIterator* it) {
        GOOGLE_DCHECK(node_ != NULL && m_ != NULL);
        // Force bucket_index_ to be in range.
        bucket_index_ &= (m_->num_buckets_ - 1);
        // Common case: the bucket we think is relevant points to node_.
        if (m_->table_[bucket_index_] == static_cast<void*>(node_)) return true;
        // Less common: the bucket is a linked list with node_ somewhere in it,
        // but not at the head.
        if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
          Node* l = static_cast<Node*>(m_->table_[bucket_index_]);
          while ((l = l->next) != NULL) {
            if (l == node_) {
              return true;
            }
          }
        }
        // Well, bucket_index_ still might be correct, but probably
        // not.  Revalidate just to be sure.  This case is rare enough that we
        // don't worry about potential optimizations, such as having a custom
        // find-like method that compares Node* instead of const Key&.
        iterator_base i(m_->find(*KeyPtrFromNodePtr(node_), it));
        bucket_index_ = i.bucket_index_;
        return m_->TableEntryIsList(bucket_index_);
      }